

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_settings::bulk_get
          (session_settings *this,
          function<void_(const_libtorrent::aux::session_settings_single_thread_&)> *f)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m_mutex);
  ::std::function<void_(const_libtorrent::aux::session_settings_single_thread_&)>::operator()
            (f,&this->m_store);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void session_settings::bulk_get(std::function<void(session_settings_single_thread const&)> f) const
	{
		std::unique_lock<std::mutex> l(m_mutex);
		f(m_store);
	}